

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O2

application * __thiscall
cppcms::application_specific_pool::get_new(application_specific_pool *this,service *srv)

{
  int iVar1;
  undefined4 extraout_var;
  __shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  __weak_ptr<cppcms::application_specific_pool,(__gnu_cxx::_Lock_policy)2> local_28 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_20;
  application *this_00;
  
  iVar1 = (*this->_vptr_application_specific_pool[2])();
  this_00 = (application *)CONCAT44(extraout_var,iVar1);
  if (this_00 != (application *)0x0) {
    std::__shared_ptr<cppcms::application_specific_pool,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<cppcms::application_specific_pool,void>
              ((__shared_ptr<cppcms::application_specific_pool,(__gnu_cxx::_Lock_policy)2> *)
               &_Stack_38,
               (__weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<cppcms::application_specific_pool>);
    std::__weak_ptr<cppcms::application_specific_pool,(__gnu_cxx::_Lock_policy)2>::
    __weak_ptr<cppcms::application_specific_pool,void>(local_28,&_Stack_38);
    application::set_pool(this_00,(weak_ptr<cppcms::application_specific_pool> *)local_28);
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_20);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  }
  return this_00;
}

Assistant:

application *application_specific_pool::get_new(service &srv)
{
	application *a = new_application(srv);
	if(!a)
		return 0;
	a->set_pool(shared_from_this());
	return a;
}